

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

uint av1_int_pro_motion_estimation
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col,MV *ref_mv,
               uint *y_sad_zero,int me_search_size_col,int me_search_size_row)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  aom_tune_content aVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  uint8_t *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  MV MVar14;
  YV12_BUFFER_CONFIG *src;
  buf_2d *pbVar15;
  int_mv *mv;
  int16_t *ref;
  int16_t *ref_00;
  int16_t *src_00;
  int16_t *src_01;
  long lVar16;
  undefined7 in_register_00000011;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint8_t *puVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  int best_sad_row;
  int best_sad_col;
  uint this_sad [4];
  buf_2d backup_yv12 [3];
  FullMvLimits mv_limits;
  
  pMVar6 = *(x->e_mbd).mi;
  backup_yv12[2].width = 0;
  backup_yv12[2].height = 0;
  backup_yv12[2].stride = 0;
  backup_yv12[2]._28_4_ = 0;
  backup_yv12[2].buf = (uint8_t *)0x0;
  backup_yv12[2].buf0 = (uint8_t *)0x0;
  backup_yv12[1].width = 0;
  backup_yv12[1].height = 0;
  backup_yv12[1].stride = 0;
  backup_yv12[1]._28_4_ = 0;
  backup_yv12[1].buf = (uint8_t *)0x0;
  backup_yv12[1].buf0 = (uint8_t *)0x0;
  backup_yv12[0].width = 0;
  backup_yv12[0].height = 0;
  backup_yv12[0].stride = 0;
  backup_yv12[0]._28_4_ = 0;
  backup_yv12[0].buf = (uint8_t *)0x0;
  backup_yv12[0].buf0 = (uint8_t *)0x0;
  aVar4 = (cpi->oxcf).tune_cfg.content;
  if (aVar4 == AOM_CONTENT_SCREEN) {
    bVar22 = ((cpi->common).seq_params)->sb_size == bsize;
  }
  else {
    bVar22 = false;
  }
  uVar18 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar10 = (cpi->oxcf).border_in_pixels & 0xfffffff0;
  iVar17 = mi_col * 4 - me_search_size_col;
  if ((SBORROW4(iVar17,-uVar10) != (int)(iVar17 + uVar10) < 0) ||
     ((int)((cpi->common).width + uVar10) < mi_col * 4 + me_search_size_col)) {
    me_search_size_col = uVar10;
  }
  iVar17 = mi_row * 4 - me_search_size_row;
  if ((SBORROW4(iVar17,-uVar10) != (int)(iVar17 + uVar10) < 0) ||
     ((int)((cpi->common).height + uVar10) < mi_row * 4 + me_search_size_row)) {
    me_search_size_row = uVar10;
  }
  bVar1 = block_size_wide[uVar18];
  bVar2 = block_size_high[uVar18];
  iVar17 = x->plane[0].src.stride;
  iVar5 = (x->e_mbd).plane[0].pre[0].stride;
  bVar3 = ""[uVar18];
  src = av1_get_scaled_ref_frame(cpi,(int)pMVar6->ref_frame[0]);
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar15 = (x->e_mbd).plane[0].pre;
    for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
      puVar7 = pbVar15->buf;
      puVar21 = pbVar15->buf0;
      uVar8 = *(undefined8 *)&pbVar15->stride;
      *(undefined8 *)((long)&backup_yv12[0].width + lVar16) = *(undefined8 *)&pbVar15->width;
      *(undefined8 *)((long)&backup_yv12[0].stride + lVar16) = uVar8;
      *(uint8_t **)((long)&backup_yv12[0].buf + lVar16) = puVar7;
      *(uint8_t **)((long)&backup_yv12[0].buf0 + lVar16) = puVar21;
      pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
    }
    av1_setup_pre_planes(&x->e_mbd,0,src,mi_row,mi_col,(scale_factors *)0x0,3);
  }
  mv = pMVar6->mv;
  if ((x->e_mbd).bd == 8) {
    uVar10 = (uint)(aVar4 == AOM_CONTENT_SCREEN);
    iVar11 = bVar3 + 1;
    lVar20 = (long)(me_search_size_col * 2) + (ulong)bVar1;
    lVar16 = (long)(me_search_size_row * 2) + (ulong)bVar2;
    ref = (int16_t *)aom_malloc(lVar20 * 2);
    ref_00 = (int16_t *)aom_malloc(lVar16 * 2);
    src_00 = (int16_t *)aom_malloc((ulong)((uint)bVar1 * 2));
    src_01 = (int16_t *)aom_malloc((ulong)((uint)bVar2 * 2));
    auVar23._0_4_ = -(uint)((int)((ulong)ref >> 0x20) == 0 && (int)ref == 0);
    auVar23._4_4_ = -(uint)((int)ref_00 == 0 && (int)((ulong)ref_00 >> 0x20) == 0);
    auVar23._8_4_ = -(uint)((int)((ulong)src_00 >> 0x20) == 0 && (int)src_00 == 0);
    auVar23._12_4_ = -(uint)((int)src_01 == 0 && (int)((ulong)src_01 >> 0x20) == 0);
    iVar12 = movmskps((int)src_01,auVar23);
    if (iVar12 != 0) {
      aom_free(ref);
      aom_free(ref_00);
      aom_free(src_00);
      aom_free(src_01);
      aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
    }
    (*aom_int_pro_row)(ref,(x->e_mbd).plane[0].pre[0].buf + -(long)me_search_size_col,iVar5,
                       (int)lVar20,(uint)bVar2,iVar11);
    (*aom_int_pro_col)(ref_00,(x->e_mbd).plane[0].pre[0].buf + -(long)(iVar5 * me_search_size_row),
                       iVar5,(uint)bVar1,(int)lVar16,3);
    puVar7 = x->plane[0].src.buf;
    (*aom_int_pro_row)(src_00,puVar7,iVar17,(uint)bVar1,(uint)bVar2,iVar11);
    (*aom_int_pro_col)(src_01,puVar7,iVar17,(uint)bVar1,(uint)bVar2,3);
    iVar11 = av1_vector_match(ref,src_00,(uint)""[uVar18],me_search_size_col,uVar10,&best_sad_col);
    pMVar6->mv[0].as_mv.col = (int16_t)iVar11;
    iVar11 = av1_vector_match(ref_00,src_01,(uint)bVar3,me_search_size_row,uVar10,&best_sad_row);
    pMVar6->mv[0].as_mv.row = (int16_t)iVar11;
    if (aVar4 == AOM_CONTENT_SCREEN) {
      if (best_sad_col < best_sad_row) {
        (mv->as_mv).row = 0;
      }
      else {
        pMVar6->mv[0].as_mv.col = 0;
      }
    }
    MVar14 = mv->as_mv;
    uVar19 = (uint)MVar14 >> 0x10;
    puVar7 = x->plane[0].src.buf;
    puVar21 = (x->e_mbd).plane[0].pre[0].buf +
              (((int)MVar14 >> 0x10) + (int)MVar14.row * (x->e_mbd).plane[0].pre[0].stride);
    uVar10 = (*cpi->ppi->fn_ptr[uVar18].sdf)(puVar7,iVar17,puVar21,iVar5);
    if (mv->as_int == 0) {
      *y_sad_zero = uVar10;
    }
    else {
      uVar13 = (*cpi->ppi->fn_ptr[uVar18].sdf)
                         (x->plane[0].src.buf,iVar17,(x->e_mbd).plane[0].pre[0].buf,iVar5);
      *y_sad_zero = uVar13;
      if (uVar13 < uVar10) {
        mv->as_int = 0;
        puVar21 = (x->e_mbd).plane[0].pre[0].buf;
        uVar19 = 0;
        MVar14.row = 0;
        MVar14.col = 0;
        uVar10 = uVar13;
      }
    }
    if (!bVar22) {
      mv_limits._0_8_ = (long)puVar21 - (long)iVar5;
      mv_limits._8_8_ = puVar21 + -1;
      (*cpi->ppi->fn_ptr[uVar18].sdx4df)(puVar7,iVar17,(uint8_t **)&mv_limits,iVar5,this_sad);
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        uVar13 = this_sad[lVar16];
        if (uVar13 < uVar10) {
          pMVar6->mv[0].as_mv.row =
               av1_int_pro_motion_estimation::search_pos[lVar16].row + MVar14.row;
          pMVar6->mv[0].as_mv.col =
               av1_int_pro_motion_estimation::search_pos[lVar16].col + (short)uVar19;
          uVar10 = uVar13;
        }
      }
      uVar13 = (int)MVar14 + (-(uint)(this_sad[0] < this_sad[3]) | 1);
      iVar11 = uVar19 + (-(uint)(this_sad[1] < this_sad[2]) | 1);
      uVar19 = (*cpi->ppi->fn_ptr[uVar18].sdf)
                         (puVar7,iVar17,
                          (x->e_mbd).plane[0].pre[0].buf +
                          ((int)(short)iVar11 +
                          (int)(short)uVar13 * (x->e_mbd).plane[0].pre[0].stride),iVar5);
      if (uVar19 < uVar10) {
        mv->as_int = uVar13 & 0xffff | iVar11 * 0x10000;
        uVar10 = uVar19;
      }
    }
    mv_limits.col_min = (x->mv_limits).col_min;
    mv_limits.col_max = (x->mv_limits).col_max;
    mv_limits.row_min = (x->mv_limits).row_min;
    mv_limits.row_max = (x->mv_limits).row_max;
    av1_set_mv_search_range(&mv_limits,ref_mv);
    clamp_fullmv(&mv->as_fullmv,&mv_limits);
    MVar14 = get_mv_from_fullmv(&mv->as_fullmv);
    mv->as_mv = MVar14;
    if (src != (YV12_BUFFER_CONFIG *)0x0) {
      pbVar15 = (x->e_mbd).plane[0].pre;
      for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
        puVar7 = *(uint8_t **)((long)&backup_yv12[0].buf + lVar16);
        puVar21 = *(uint8_t **)((long)&backup_yv12[0].buf0 + lVar16);
        uVar8 = *(undefined8 *)((long)&backup_yv12[0].width + lVar16);
        uVar9 = *(undefined8 *)((long)&backup_yv12[0].stride + lVar16);
        pbVar15->width = (int)uVar8;
        pbVar15->height = (int)((ulong)uVar8 >> 0x20);
        *(undefined8 *)&pbVar15->stride = uVar9;
        pbVar15->buf = puVar7;
        pbVar15->buf0 = puVar21;
        pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
      }
    }
    aom_free(ref);
    aom_free(ref_00);
    aom_free(src_00);
    aom_free(src_01);
  }
  else {
    mv->as_int = 0;
    uVar10 = (*cpi->ppi->fn_ptr[uVar18].sdf)
                       (x->plane[0].src.buf,iVar17,(x->e_mbd).plane[0].pre[0].buf,iVar5);
    if (src != (YV12_BUFFER_CONFIG *)0x0) {
      pbVar15 = (x->e_mbd).plane[0].pre;
      for (lVar16 = 0; lVar16 != 0x60; lVar16 = lVar16 + 0x20) {
        puVar7 = *(uint8_t **)((long)&backup_yv12[0].buf + lVar16);
        puVar21 = *(uint8_t **)((long)&backup_yv12[0].buf0 + lVar16);
        uVar8 = *(undefined8 *)((long)&backup_yv12[0].width + lVar16);
        uVar9 = *(undefined8 *)((long)&backup_yv12[0].stride + lVar16);
        pbVar15->width = (int)uVar8;
        pbVar15->height = (int)((ulong)uVar8 >> 0x20);
        *(undefined8 *)&pbVar15->stride = uVar9;
        pbVar15->buf = puVar7;
        pbVar15->buf0 = puVar21;
        pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
      }
    }
  }
  return uVar10;
}

Assistant:

unsigned int av1_int_pro_motion_estimation(const AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize, int mi_row,
                                           int mi_col, const MV *ref_mv,
                                           unsigned int *y_sad_zero,
                                           int me_search_size_col,
                                           int me_search_size_row) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int idx;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int is_screen = cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  const int full_search = is_screen;
  const bool screen_scroll_superblock =
      is_screen && bsize == cm->seq_params->sb_size;
  // Keep border a multiple of 16.
  const int border = (cpi->oxcf.border_in_pixels >> 4) << 4;
  int search_size_width = me_search_size_col;
  int search_size_height = me_search_size_row;
  // Adjust based on boundary.
  if (((mi_col << 2) - search_size_width < -border) ||
      ((mi_col << 2) + search_size_width > cm->width + border))
    search_size_width = border;
  if (((mi_row << 2) - search_size_height < -border) ||
      ((mi_row << 2) + search_size_height > cm->height + border))
    search_size_height = border;
  const int src_stride = x->plane[0].src.stride;
  const int ref_stride = xd->plane[0].pre[0].stride;
  uint8_t const *ref_buf, *src_buf;
  int_mv *best_int_mv = &xd->mi[0]->mv[0];
  unsigned int best_sad, tmp_sad, this_sad[4];
  int best_sad_col, best_sad_row;
  const int row_norm_factor = mi_size_high_log2[bsize] + 1;
  const int col_norm_factor = 3 + (bw >> 5);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, mi->ref_frame[0]);
  static const MV search_pos[4] = {
    { -1, 0 },
    { 0, -1 },
    { 0, 1 },
    { 1, 0 },
  };

  if (scaled_ref_frame) {
    int i;
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // motion search code to be used without additional modifications.
    for (i = 0; i < MAX_MB_PLANE; i++) backup_yv12[i] = xd->plane[i].pre[0];
    av1_setup_pre_planes(xd, 0, scaled_ref_frame, mi_row, mi_col, NULL,
                         MAX_MB_PLANE);
  }

  if (xd->bd != 8) {
    best_int_mv->as_fullmv = kZeroFullMv;
    best_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                           xd->plane[0].pre[0].buf, ref_stride);

    if (scaled_ref_frame) {
      int i;
      for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
    }
    return best_sad;
  }
  const int width_ref_buf = (search_size_width << 1) + bw;
  const int height_ref_buf = (search_size_height << 1) + bh;
  int16_t *hbuf = (int16_t *)aom_malloc(width_ref_buf * sizeof(*hbuf));
  int16_t *vbuf = (int16_t *)aom_malloc(height_ref_buf * sizeof(*vbuf));
  int16_t *src_hbuf = (int16_t *)aom_malloc(bw * sizeof(*src_hbuf));
  int16_t *src_vbuf = (int16_t *)aom_malloc(bh * sizeof(*src_vbuf));
  if (!hbuf || !vbuf || !src_hbuf || !src_vbuf) {
    aom_free(hbuf);
    aom_free(vbuf);
    aom_free(src_hbuf);
    aom_free(src_vbuf);
    aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }

  // Set up prediction 1-D reference set for rows.
  ref_buf = xd->plane[0].pre[0].buf - search_size_width;
  aom_int_pro_row(hbuf, ref_buf, ref_stride, width_ref_buf, bh,
                  row_norm_factor);

  // Set up prediction 1-D reference set for cols
  ref_buf = xd->plane[0].pre[0].buf - search_size_height * ref_stride;
  aom_int_pro_col(vbuf, ref_buf, ref_stride, bw, height_ref_buf,
                  col_norm_factor);

  // Set up src 1-D reference set
  src_buf = x->plane[0].src.buf;
  aom_int_pro_row(src_hbuf, src_buf, src_stride, bw, bh, row_norm_factor);
  aom_int_pro_col(src_vbuf, src_buf, src_stride, bw, bh, col_norm_factor);

  // Find the best match per 1-D search
  best_int_mv->as_fullmv.col =
      av1_vector_match(hbuf, src_hbuf, mi_size_wide_log2[bsize],
                       search_size_width, full_search, &best_sad_col);
  best_int_mv->as_fullmv.row =
      av1_vector_match(vbuf, src_vbuf, mi_size_high_log2[bsize],
                       search_size_height, full_search, &best_sad_row);

  // For screen: select between horiz or vert motion.
  if (is_screen) {
    if (best_sad_col < best_sad_row)
      best_int_mv->as_fullmv.row = 0;
    else
      best_int_mv->as_fullmv.col = 0;
  }

  FULLPEL_MV this_mv = best_int_mv->as_fullmv;
  src_buf = x->plane[0].src.buf;
  ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);
  best_sad =
      cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);

  // Evaluate zero MV if found MV is non-zero.
  if (best_int_mv->as_int != 0) {
    tmp_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                          xd->plane[0].pre[0].buf, ref_stride);
    *y_sad_zero = tmp_sad;
    if (tmp_sad < best_sad) {
      best_int_mv->as_fullmv = kZeroFullMv;
      this_mv = best_int_mv->as_fullmv;
      ref_buf = xd->plane[0].pre[0].buf;
      best_sad = tmp_sad;
    }
  } else {
    *y_sad_zero = best_sad;
  }

  if (!screen_scroll_superblock) {
    const uint8_t *const pos[4] = {
      ref_buf - ref_stride,
      ref_buf - 1,
      ref_buf + 1,
      ref_buf + ref_stride,
    };

    cpi->ppi->fn_ptr[bsize].sdx4df(src_buf, src_stride, pos, ref_stride,
                                   this_sad);

    for (idx = 0; idx < 4; ++idx) {
      if (this_sad[idx] < best_sad) {
        best_sad = this_sad[idx];
        best_int_mv->as_fullmv.row = search_pos[idx].row + this_mv.row;
        best_int_mv->as_fullmv.col = search_pos[idx].col + this_mv.col;
      }
    }

    if (this_sad[0] < this_sad[3])
      this_mv.row -= 1;
    else
      this_mv.row += 1;

    if (this_sad[1] < this_sad[2])
      this_mv.col -= 1;
    else
      this_mv.col += 1;

    ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);

    tmp_sad =
        cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);
    if (best_sad > tmp_sad) {
      best_int_mv->as_fullmv = this_mv;
      best_sad = tmp_sad;
    }
  }

  FullMvLimits mv_limits = x->mv_limits;
  av1_set_mv_search_range(&mv_limits, ref_mv);
  clamp_fullmv(&best_int_mv->as_fullmv, &mv_limits);

  convert_fullmv_to_mv(best_int_mv);

  if (scaled_ref_frame) {
    int i;
    for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
  }

  aom_free(hbuf);
  aom_free(vbuf);
  aom_free(src_hbuf);
  aom_free(src_vbuf);
  return best_sad;
}